

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O2

fdb_status fdb_doc_update(fdb_doc **doc,void *meta,size_t metalen,void *body,size_t bodylen)

{
  void *pvVar1;
  fdb_doc *pfVar2;
  fdb_status fVar3;
  
  fVar3 = FDB_RESULT_INVALID_ARGS;
  if (((metalen < 0x10000 && doc != (fdb_doc **)0x0) && bodylen >> 0x20 == 0) &&
     (pfVar2 = *doc, pfVar2 != (fdb_doc *)0x0)) {
    if (metalen != 0 && meta != (void *)0x0) {
      free(pfVar2->meta);
      pvVar1 = malloc(metalen);
      (*doc)->meta = pvVar1;
      if ((*doc)->meta == (void *)0x0) {
        return FDB_RESULT_ALLOC_FAIL;
      }
      memcpy((*doc)->meta,meta,metalen);
      pfVar2 = *doc;
      pfVar2->metalen = metalen;
    }
    if (bodylen != 0 && body != (void *)0x0) {
      free(pfVar2->body);
      pvVar1 = malloc(bodylen);
      (*doc)->body = pvVar1;
      if ((*doc)->body == (void *)0x0) {
        return FDB_RESULT_ALLOC_FAIL;
      }
      memcpy((*doc)->body,body,bodylen);
      pfVar2 = *doc;
      pfVar2->bodylen = bodylen;
    }
    pfVar2->seqnum = 0xffffffffffffffff;
    fVar3 = FDB_RESULT_SUCCESS;
  }
  return fVar3;
}

Assistant:

LIBFDB_API
fdb_status fdb_doc_update(fdb_doc **doc,
                          const void *meta, size_t metalen,
                          const void *body, size_t bodylen)
{
    if (doc == NULL ||
        metalen > FDB_MAX_METALEN || bodylen > FDB_MAX_BODYLEN) {
        return FDB_RESULT_INVALID_ARGS;
    }
    if (*doc == NULL) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (meta && metalen > 0) {
        // free previous metadata
        free((*doc)->meta);
        // allocate new metadata
        (*doc)->meta = (void *)malloc(metalen);
        if ((*doc)->meta == NULL) { // LCOV_EXCL_START
            return FDB_RESULT_ALLOC_FAIL;
        } // LCOV_EXCL_STOP
        memcpy((*doc)->meta, meta, metalen);
        (*doc)->metalen = metalen;
    }

    if (body && bodylen > 0) {
        // free previous body
        free((*doc)->body);
        // allocate new body
        (*doc)->body = (void *)malloc(bodylen);
        if ((*doc)->body == NULL) { // LCOV_EXCL_START
            return FDB_RESULT_ALLOC_FAIL;
        } // LCOV_EXCL_STOP
        memcpy((*doc)->body, body, bodylen);
        (*doc)->bodylen = bodylen;
    }

    (*doc)->seqnum = SEQNUM_NOT_USED;
    return FDB_RESULT_SUCCESS;
}